

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O3

void __thiscall
adios2::core::
Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~Attribute(Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  pointer pcVar1;
  
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__Attribute_008698b0;
  pcVar1 = (this->m_DataSingleValue)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_DataSingleValue).field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_DataArray);
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__AttributeBase_00869cf8;
  pcVar1 = (this->super_AttributeBase).m_Name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_AttributeBase).m_Name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Attribute() = default;